

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

char * getLinkInterfaceDependentProperty<char_const*>
                 (cmGeneratorTarget *tgt,string *prop,string *config,CompatibleType t,char **param_5
                 )

{
  char **param_4_local;
  CompatibleType t_local;
  string *config_local;
  string *prop_local;
  cmGeneratorTarget *tgt_local;
  
  switch(t) {
  case BoolType:
    __assert_fail("0 && \"String compatibility check function called for boolean\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0xf29,
                  "const char *getLinkInterfaceDependentProperty(const cmGeneratorTarget *, const std::string &, const std::string &, CompatibleType, const char **)"
                 );
  case StringType:
    tgt_local = (cmGeneratorTarget *)
                cmGeneratorTarget::GetLinkInterfaceDependentStringProperty(tgt,prop,config);
    break;
  case NumberMinType:
    tgt_local = (cmGeneratorTarget *)
                cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty(tgt,prop,config);
    break;
  case NumberMaxType:
    tgt_local = (cmGeneratorTarget *)
                cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty(tgt,prop,config);
    break;
  default:
    __assert_fail("0 && \"Unreachable!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0xf32,
                  "const char *getLinkInterfaceDependentProperty(const cmGeneratorTarget *, const std::string &, const std::string &, CompatibleType, const char **)"
                 );
  }
  return (char *)tgt_local;
}

Assistant:

const char * getLinkInterfaceDependentProperty(cmGeneratorTarget const* tgt,
                                               const std::string& prop,
                                               const std::string& config,
                                               CompatibleType t,
                                               const char **)
{
  switch(t)
  {
  case BoolType:
    assert(0 && "String compatibility check function called for boolean");
    return 0;
  case StringType:
    return tgt->GetLinkInterfaceDependentStringProperty(prop, config);
  case NumberMinType:
    return tgt->GetLinkInterfaceDependentNumberMinProperty(prop, config);
  case NumberMaxType:
    return tgt->GetLinkInterfaceDependentNumberMaxProperty(prop, config);
  }
  assert(0 && "Unreachable!");
  return 0;
}